

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

int bit_encode_free(bit_encode_t *be)

{
  short sVar1;
  bit_encode_t *be_local;
  
  if (be == (bit_encode_t *)0x0) {
    be_local._4_4_ = 0;
  }
  else {
    sVar1 = be->refcount + -1;
    be->refcount = sVar1;
    if (sVar1 < 1) {
      ckd_free(be);
      be_local._4_4_ = 0;
    }
    else {
      be_local._4_4_ = (int)be->refcount;
    }
  }
  return be_local._4_4_;
}

Assistant:

int
bit_encode_free(bit_encode_t *be)
{
    if (be == NULL)
        return 0;
    if (--be->refcount > 0)
        return be->refcount;
    ckd_free(be);

    return 0;
}